

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O3

double SSIMGetClipped_C(uint8_t *src1,int stride1,uint8_t *src2,int stride2,int xo,int yo,int W,
                       int H)

{
  byte bVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint8_t *puVar8;
  undefined4 in_register_0000008c;
  int iVar9;
  int iVar10;
  ulong uVar11;
  VP8DistoStats local_80;
  ulong local_68;
  undefined8 local_60;
  ulong local_58;
  long local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_60 = CONCAT44(in_register_0000008c,yo);
  local_80.xm = 0;
  local_80.ym = 0;
  local_80.xxm = 0;
  local_80.xym = 0;
  local_80.yym = 0;
  uVar7 = 3;
  if (3 < yo) {
    uVar7 = yo;
  }
  iVar9 = uVar7 - 3;
  uVar3 = H - 1U;
  if ((int)(yo + 3U) < (int)(H - 1U)) {
    uVar3 = yo + 3U;
  }
  local_80.w = 0;
  if (iVar9 <= (int)uVar3) {
    uVar4 = W - 1U;
    if ((int)(xo + 3U) < (int)(W - 1U)) {
      uVar4 = xo + 3U;
    }
    local_40 = (ulong)uVar4;
    local_68 = 3;
    if (3 < xo) {
      local_68 = (ulong)(uint)xo;
    }
    puVar6 = src2 + iVar9 * stride2;
    puVar8 = src1 + iVar9 * stride1;
    local_48 = (long)stride1;
    local_50 = (long)stride2;
    local_58 = (ulong)uVar3;
    local_80.yym = 0;
    local_80.xym = 0;
    local_80.xxm = 0;
    local_80.ym = 0;
    local_80.xm = 0;
    local_80.w = 0;
    lVar5 = (ulong)uVar7 - 3;
    do {
      local_38 = lVar5;
      if ((int)local_68 + -3 <= (int)uVar4) {
        uVar11 = local_68;
        do {
          iVar9 = kWeight[(int)uVar11 - xo] * kWeight[((int)local_38 - yo) + 3];
          iVar10 = iVar9 * (uint)puVar8[uVar11 - 3];
          local_80.xxm = local_80.xxm + (uint)puVar8[uVar11 - 3] * iVar10;
          bVar1 = puVar6[uVar11 - 3];
          local_80.xm = local_80.xm + iVar10;
          local_80.xym = local_80.xym + iVar10 * (uint)bVar1;
          local_80.w = local_80.w + iVar9;
          iVar9 = iVar9 * (uint)bVar1;
          local_80.ym = local_80.ym + iVar9;
          local_80.yym = local_80.yym + iVar9 * (uint)bVar1;
          uVar11 = uVar11 + 1;
        } while (uVar4 + 4 != (int)uVar11);
      }
      puVar8 = puVar8 + local_48;
      puVar6 = puVar6 + local_50;
      lVar5 = local_38 + 1;
    } while (local_38 < (long)local_58);
  }
  dVar2 = VP8SSIMFromStatsClipped(&local_80);
  return dVar2;
}

Assistant:

static double SSIMGetClipped_C(const uint8_t* src1, int stride1,
                               const uint8_t* src2, int stride2,
                               int xo, int yo, int W, int H) {
  VP8DistoStats stats = { 0, 0, 0, 0, 0, 0 };
  const int ymin = (yo - VP8_SSIM_KERNEL < 0) ? 0 : yo - VP8_SSIM_KERNEL;
  const int ymax = (yo + VP8_SSIM_KERNEL > H - 1) ? H - 1
                                                  : yo + VP8_SSIM_KERNEL;
  const int xmin = (xo - VP8_SSIM_KERNEL < 0) ? 0 : xo - VP8_SSIM_KERNEL;
  const int xmax = (xo + VP8_SSIM_KERNEL > W - 1) ? W - 1
                                                  : xo + VP8_SSIM_KERNEL;
  int x, y;
  src1 += ymin * stride1;
  src2 += ymin * stride2;
  for (y = ymin; y <= ymax; ++y, src1 += stride1, src2 += stride2) {
    for (x = xmin; x <= xmax; ++x) {
      const uint32_t w = kWeight[VP8_SSIM_KERNEL + x - xo]
                       * kWeight[VP8_SSIM_KERNEL + y - yo];
      const uint32_t s1 = src1[x];
      const uint32_t s2 = src2[x];
      stats.w   += w;
      stats.xm  += w * s1;
      stats.ym  += w * s2;
      stats.xxm += w * s1 * s1;
      stats.xym += w * s1 * s2;
      stats.yym += w * s2 * s2;
    }
  }
  return VP8SSIMFromStatsClipped(&stats);
}